

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

Result<std::shared_ptr<const_CTransaction>_> * __thiscall
wallet::anon_unknown_5::WalletImpl::createTransaction
          (WalletImpl *this,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *recipients,
          CCoinControl *coin_control,bool sign,int *change_pos,CAmount *fee)

{
  long lVar1;
  bool bVar2;
  element_type *result;
  T *pTVar3;
  uint *puVar4;
  char *in_RSI;
  Result<std::shared_ptr<const_CTransaction>_> *in_RDI;
  uint *in_R9;
  long in_FS_OFFSET;
  CAmount *in_stack_00000008;
  T *txr;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  Result<wallet::CreatedTransactionResult> res;
  __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe48;
  Error *in_stack_fffffffffffffe50;
  T *obj;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  uint uVar5;
  Result<std::shared_ptr<const_CTransaction>_> *pszFile;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffe80;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffe88;
  T local_120;
  _Optional_payload_base<int> local_110 [2];
  undefined1 in_stack_ffffffffffffff07;
  CCoinControl *in_stack_ffffffffffffff08;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *in_stack_ffffffffffffff10;
  CWallet *in_stack_ffffffffffffff18;
  _Optional_payload_base<unsigned_int> in_stack_ffffffffffffff50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszFile = in_RDI;
  _GLOBAL__N_1::std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->(in_stack_fffffffffffffe48);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe48);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_RSI,(char *)pszFile,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  result = _GLOBAL__N_1::std::
           __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  if (*in_R9 == 0xffffffff) {
    std::optional<int>::optional((optional<int> *)local_110);
  }
  else {
    local_110[0] = (_Optional_payload_base<int>)
                   std::make_optional<int&>((int *)in_stack_fffffffffffffe50);
  }
  _GLOBAL__N_1::std::optional<unsigned_int>::optional<int,_true>
            ((optional<unsigned_int> *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
             ,(optional<int> *)in_stack_fffffffffffffe50);
  CreateTransaction(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    (optional<unsigned_int>)in_stack_ffffffffffffff50,in_stack_ffffffffffffff08,
                    (bool)in_stack_ffffffffffffff07);
  bVar2 = util::Result::operator_cast_to_bool
                    ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffffe48);
  if (bVar2) {
    pTVar3 = util::Result<wallet::CreatedTransactionResult>::operator*
                       ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffffe48);
    *in_stack_00000008 = pTVar3->fee;
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<unsigned_int> *)in_stack_fffffffffffffe48);
    if (bVar2) {
      puVar4 = std::optional<unsigned_int>::operator*
                         ((optional<unsigned_int> *)in_stack_fffffffffffffe48);
      uVar5 = *puVar4;
    }
    else {
      uVar5 = 0xffffffff;
    }
    *in_R9 = uVar5;
    obj = &local_120;
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffe48,
               (shared_ptr<const_CTransaction> *)0x95b2c3);
    util::Result<std::shared_ptr<const_CTransaction>_>::Result
              ((Result<std::shared_ptr<const_CTransaction>_> *)
               CONCAT44(uVar5,in_stack_fffffffffffffe58),obj);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffe48);
  }
  else {
    util::ErrorString<wallet::CreatedTransactionResult>
              ((Result<wallet::CreatedTransactionResult> *)result);
    util::Result<std::shared_ptr<const_CTransaction>_>::Result
              ((Result<std::shared_ptr<const_CTransaction>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe50);
    util::Error::~Error((Error *)in_stack_fffffffffffffe48);
  }
  util::Result<wallet::CreatedTransactionResult>::~Result
            ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffffe48);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pszFile;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CTransactionRef> createTransaction(const std::vector<CRecipient>& recipients,
        const CCoinControl& coin_control,
        bool sign,
        int& change_pos,
        CAmount& fee) override
    {
        LOCK(m_wallet->cs_wallet);
        auto res = CreateTransaction(*m_wallet, recipients, change_pos == -1 ? std::nullopt : std::make_optional(change_pos),
                                     coin_control, sign);
        if (!res) return util::Error{util::ErrorString(res)};
        const auto& txr = *res;
        fee = txr.fee;
        change_pos = txr.change_pos ? int(*txr.change_pos) : -1;

        return txr.tx;
    }